

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O0

void __thiscall
mocker::nasm::Module::emplaceDirective<mocker::nasm::Global,char_const(&)[5]>
          (Module *this,char (*args) [5])

{
  shared_ptr<mocker::nasm::Global> local_28;
  char (*local_18) [5];
  char (*args_local) [5];
  Module *this_local;
  
  local_18 = args;
  args_local = (char (*) [5])this;
  std::make_shared<mocker::nasm::Global,char_const(&)[5]>((char (*) [5])&local_28);
  std::
  vector<std::shared_ptr<mocker::nasm::Directive>,std::allocator<std::shared_ptr<mocker::nasm::Directive>>>
  ::emplace_back<std::shared_ptr<mocker::nasm::Global>>
            ((vector<std::shared_ptr<mocker::nasm::Directive>,std::allocator<std::shared_ptr<mocker::nasm::Directive>>>
              *)this,&local_28);
  std::shared_ptr<mocker::nasm::Global>::~shared_ptr(&local_28);
  return;
}

Assistant:

void emplaceDirective(Args &&... args) {
    directives.emplace_back(
        std::make_shared<Type>(std::forward<Args>(args)...));
  }